

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cram_io.c
# Opt level: O0

char * cram_compress_by_method
                 (char *in,size_t in_size,size_t *out_size,cram_block_method method,int level,
                 int strat)

{
  uchar *cp_1;
  uint out_size_i_1;
  uchar *cp;
  uint out_size_i;
  int strat_local;
  int level_local;
  cram_block_method method_local;
  size_t *out_size_local;
  size_t in_size_local;
  char *in_local;
  
  cp._4_4_ = strat;
  out_size_i = level;
  strat_local = method;
  _level_local = out_size;
  out_size_local = (size_t *)in_size;
  in_size_local = (size_t)in;
  switch(method) {
  case RAW:
    in_local = (char *)0x0;
    break;
  case GZIP:
    in_local = zlib_mem_deflate(in,in_size,out_size,level,strat);
    break;
  case BZIP2:
    in_local = (char *)0x0;
    break;
  case LZMA:
    in_local = (char *)0x0;
    break;
  case RANS:
    in_local = (char *)rans_compress((uchar *)in,(uint)in_size,(uint *)&cp,0);
    *_level_local = (ulong)(uint)cp;
    break;
  default:
    in_local = (char *)0x0;
    break;
  case RANS1:
    in_local = (char *)rans_compress((uchar *)in,(uint)in_size,(uint *)((long)&cp_1 + 4),1);
    *_level_local = (ulong)cp_1._4_4_;
  }
  return in_local;
}

Assistant:

static char *cram_compress_by_method(char *in, size_t in_size,
				     size_t *out_size,
				     enum cram_block_method method,
				     int level, int strat) {
    switch (method) {
    case GZIP:
	return zlib_mem_deflate(in, in_size, out_size, level, strat);

    case BZIP2: {
#ifdef HAVE_LIBBZ2
	unsigned int comp_size = in_size*1.01 + 600;
	char *comp = malloc(comp_size);
	if (!comp)
	    return NULL;

	if (BZ_OK != BZ2_bzBuffToBuffCompress(comp, &comp_size,
					      in, in_size,
					      level, 0, 30)) {
	    free(comp);
	    return NULL;
	}
	*out_size = comp_size;
	return comp;
#else
	return NULL;
#endif
    }

    case LZMA:
#ifdef HAVE_LIBLZMA
	return lzma_mem_deflate(in, in_size, out_size, level);
#else
	return NULL;
#endif

    case RANS0: {
	unsigned int out_size_i;
	unsigned char *cp;
	cp = rans_compress((unsigned char *)in, in_size, &out_size_i, 0);
	*out_size = out_size_i;
	return (char *)cp;
    }

    case RANS1: {
	unsigned int out_size_i;
	unsigned char *cp;
	
	cp = rans_compress((unsigned char *)in, in_size, &out_size_i, 1);
	*out_size = out_size_i;
	return (char *)cp;
    }

    case RAW:
	break;

    default:
	return NULL;
    }

    return NULL;
}